

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O0

void phmap::priv::(anonymous_namespace)::
     BtreeAllocatorTest<phmap::btree_set<std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,int>>>>
               (void)

{
  bool bVar1;
  pointer p;
  char *pcVar2;
  AssertHelper local_470;
  Message local_468;
  undefined1 local_460 [8];
  AssertionResult gtest_ar_13;
  pair<int,_int> local_434;
  int local_42c;
  int i_2;
  Message local_420;
  undefined1 local_418 [8];
  AssertionResult gtest_ar_12;
  Message local_400;
  int local_3f4;
  size_type local_3f0;
  undefined1 local_3e8 [8];
  AssertionResult gtest_ar_11;
  Message local_3d0;
  int local_3c4;
  size_type local_3c0;
  undefined1 local_3b8 [8];
  AssertionResult gtest_ar_10;
  Message local_3a0;
  undefined1 local_398 [8];
  AssertionResult gtest_ar_9;
  pair<int,_int> local_370;
  int64_t local_368;
  int64_t original_bytes1_2;
  key_compare local_351;
  undefined1 local_350 [8];
  btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>
  b2_2;
  key_compare local_321;
  undefined1 local_320 [8];
  btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>
  b1_2;
  Message local_2f8;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar_8;
  pair<int,_int> local_2c4;
  int local_2bc;
  int i_1;
  Message local_2b0;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar_7;
  Message local_290;
  int local_284;
  size_type local_280;
  undefined1 local_278 [8];
  AssertionResult gtest_ar_6;
  Message local_260;
  undefined1 local_258 [8];
  AssertionResult gtest_ar_5;
  pair<int,_int> local_230;
  int64_t local_228;
  int64_t original_bytes1_1;
  key_compare local_211;
  undefined1 local_210 [8];
  btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>
  b2_1;
  key_compare local_1e1;
  undefined1 local_1e0 [8];
  btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>
  b1_1;
  Message local_1b8;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_4;
  pair<int,_int> local_184;
  int local_17c;
  int i;
  Message local_170;
  undefined1 local_168 [8];
  AssertionResult gtest_ar_3;
  Message local_150;
  int local_144;
  size_type local_140;
  undefined1 local_138 [8];
  AssertionResult gtest_ar_2;
  Message local_120;
  int local_114;
  size_type local_110;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_1;
  Message local_f0;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar;
  pair<int,_int> local_c0;
  int64_t local_b8;
  int64_t original_bytes1;
  key_compare local_a1;
  undefined1 local_a0 [8];
  btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>
  b2;
  key_compare local_71;
  undefined1 local_70 [8];
  btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>
  b1;
  pointer unused2;
  pointer unused1;
  Generator<std::pair<int,_int>_> generator;
  CountingAllocator<phmap::btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>_>
  local_28;
  PropagatingCountingAlloc<phmap::btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>_>
  allocator2;
  PropagatingCountingAlloc<phmap::btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>_>
  allocator1;
  int64_t bytes2;
  int64_t bytes1;
  
  bytes2 = 0;
  allocator1.
  super_CountingAllocator<phmap::btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>_>
  .bytes_used_ = (CountingAllocator<phmap::btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>_>
                  )(int64_t *)0x0;
  anon_unknown_0::
  PropagatingCountingAlloc<phmap::btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>_>
  ::CountingAllocator(&allocator2,&bytes2);
  anon_unknown_0::
  PropagatingCountingAlloc<phmap::btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>_>
  ::CountingAllocator((PropagatingCountingAlloc<phmap::btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>_>
                       *)&local_28,(int64_t *)&allocator1);
  Generator<std::pair<int,_int>_>::Generator
            ((Generator<std::pair<int,_int>_> *)((long)&unused1 + 4),1000);
  p = CountingAllocator<phmap::btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>_>
      ::allocate(&allocator2.
                  super_CountingAllocator<phmap::btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>_>
                 ,1,(const_pointer)0x0);
  b1.
  super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
  .tree_.size_ = (size_type)
                 CountingAllocator<phmap::btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>_>
                 ::allocate(&local_28,1,(const_pointer)0x0);
  PropagatingCountingAlloc<std::pair<int,int>>::
  CountingAllocator<phmap::btree_set<std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,int>>>>
            ((PropagatingCountingAlloc<std::pair<int,int>> *)
             &b2.
              super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
              .
              super_btree_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
              .tree_.size_,
             &allocator2.
              super_CountingAllocator<phmap::btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>_>
            );
  btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>
  ::btree_container((btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>
                     *)local_70,&local_71,
                    (allocator_type *)
                    &b2.
                     super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
                     .
                     super_btree_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
                     .tree_.size_);
  anon_unknown_0::PropagatingCountingAlloc<std::pair<int,_int>_>::~PropagatingCountingAlloc
            ((PropagatingCountingAlloc<std::pair<int,_int>_> *)
             &b2.
              super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
              .
              super_btree_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
              .tree_.size_);
  PropagatingCountingAlloc<std::pair<int,int>>::
  CountingAllocator<phmap::btree_set<std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,int>>>>
            ((PropagatingCountingAlloc<std::pair<int,int>> *)&original_bytes1,&local_28);
  btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>
  ::btree_container((btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>
                     *)local_a0,&local_a1,(allocator_type *)&original_bytes1);
  anon_unknown_0::PropagatingCountingAlloc<std::pair<int,_int>_>::~PropagatingCountingAlloc
            ((PropagatingCountingAlloc<std::pair<int,_int>_> *)&original_bytes1);
  local_b8 = bytes2;
  local_c0 = Generator<std::pair<int,_int>_>::operator()
                       ((Generator<std::pair<int,_int>_> *)((long)&unused1 + 4),0);
  btree_set_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
  ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>,_std::pair<int,_int>_&,_std::pair<int,_int>_*>,_bool>
            *)&gtest_ar.message_,
           (btree_set_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
            *)local_70,&local_c0);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_e8,"bytes1","original_bytes1",&bytes2,&local_b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2be,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>
  ::operator=((btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>
               *)local_70,
              (btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>
               *)local_a0);
  local_110 = btree_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
              ::size((btree_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
                      *)local_70);
  local_114 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_108,"b1.size()","0",&local_110,&local_114);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2c2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  local_140 = btree_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
              ::size((btree_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
                      *)local_a0);
  local_144 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_138,"b2.size()","0",&local_140,&local_144);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar1) {
    testing::Message::Message(&local_150);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2c3,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_168,"bytes1","original_bytes1",&bytes2,&local_b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffe88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2c4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffffe88,&local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe88);
    testing::Message::~Message(&local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  for (local_17c = 1; local_17c < 1000; local_17c = local_17c + 1) {
    local_184 = Generator<std::pair<int,_int>_>::operator()
                          ((Generator<std::pair<int,_int>_> *)((long)&unused1 + 4),local_17c);
    btree_set_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
    ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>,_std::pair<int,_int>_&,_std::pair<int,_int>_*>,_bool>
              *)&gtest_ar_4.message_,
             (btree_set_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
              *)local_70,&local_184);
  }
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_1b0,"bytes2","bytes1",(long *)&allocator1,&bytes2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar1) {
    testing::Message::Message(&local_1b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &b1_1.
                super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
                .
                super_btree_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
                .tree_.size_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2cb,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &b1_1.
                super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
                .
                super_btree_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
                .tree_.size_,&local_1b8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &b1_1.
                super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
                .
                super_btree_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
                .tree_.size_);
    testing::Message::~Message(&local_1b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>
  ::~btree_set((btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>
                *)local_a0);
  btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>
  ::~btree_set((btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>
                *)local_70);
  PropagatingCountingAlloc<std::pair<int,int>>::
  CountingAllocator<phmap::btree_set<std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,int>>>>
            ((PropagatingCountingAlloc<std::pair<int,int>> *)
             &b2_1.
              super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
              .
              super_btree_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
              .tree_.size_,
             &allocator2.
              super_CountingAllocator<phmap::btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>_>
            );
  btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>
  ::btree_container((btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>
                     *)local_1e0,&local_1e1,
                    (allocator_type *)
                    &b2_1.
                     super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
                     .
                     super_btree_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
                     .tree_.size_);
  anon_unknown_0::PropagatingCountingAlloc<std::pair<int,_int>_>::~PropagatingCountingAlloc
            ((PropagatingCountingAlloc<std::pair<int,_int>_> *)
             &b2_1.
              super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
              .
              super_btree_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
              .tree_.size_);
  PropagatingCountingAlloc<std::pair<int,int>>::
  CountingAllocator<phmap::btree_set<std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,int>>>>
            ((PropagatingCountingAlloc<std::pair<int,int>> *)&original_bytes1_1,&local_28);
  btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>
  ::btree_container((btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>
                     *)local_210,&local_211,(allocator_type *)&original_bytes1_1);
  anon_unknown_0::PropagatingCountingAlloc<std::pair<int,_int>_>::~PropagatingCountingAlloc
            ((PropagatingCountingAlloc<std::pair<int,_int>_> *)&original_bytes1_1);
  local_228 = bytes2;
  local_230 = Generator<std::pair<int,_int>_>::operator()
                        ((Generator<std::pair<int,_int>_> *)((long)&unused1 + 4),0);
  btree_set_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
  ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>,_std::pair<int,_int>_&,_std::pair<int,_int>_*>,_bool>
            *)&gtest_ar_5.message_,
           (btree_set_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
            *)local_1e0,&local_230);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_258,"bytes1","original_bytes1",&bytes2,&local_228);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
  if (!bVar1) {
    testing::Message::Message(&local_260);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_258);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2d5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_260);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_260);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
  btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>
  ::operator=((btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>
               *)local_1e0,
              (btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>
               *)local_210);
  local_280 = btree_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
              ::size((btree_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
                      *)local_1e0);
  local_284 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_278,"b1.size()","0",&local_280,&local_284);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
  if (!bVar1) {
    testing::Message::Message(&local_290);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_278);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2d9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_290);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_290);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_2a8,"bytes1","original_bytes1",&bytes2,&local_228);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
  if (!bVar1) {
    testing::Message::Message(&local_2b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffd48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2da,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffffd48,&local_2b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffd48);
    testing::Message::~Message(&local_2b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
  for (local_2bc = 1; local_2bc < 1000; local_2bc = local_2bc + 1) {
    local_2c4 = Generator<std::pair<int,_int>_>::operator()
                          ((Generator<std::pair<int,_int>_> *)((long)&unused1 + 4),local_2bc);
    btree_set_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
    ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>,_std::pair<int,_int>_&,_std::pair<int,_int>_*>,_bool>
              *)&gtest_ar_8.message_,
             (btree_set_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
              *)local_1e0,&local_2c4);
  }
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_2f0,"bytes2","bytes1",(long *)&allocator1,&bytes2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f0);
  if (!bVar1) {
    testing::Message::Message(&local_2f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &b1_2.
                super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
                .
                super_btree_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
                .tree_.size_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2e1,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &b1_2.
                super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
                .
                super_btree_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
                .tree_.size_,&local_2f8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &b1_2.
                super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
                .
                super_btree_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
                .tree_.size_);
    testing::Message::~Message(&local_2f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
  btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>
  ::~btree_set((btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>
                *)local_210);
  btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>
  ::~btree_set((btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>
                *)local_1e0);
  PropagatingCountingAlloc<std::pair<int,int>>::
  CountingAllocator<phmap::btree_set<std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,int>>>>
            ((PropagatingCountingAlloc<std::pair<int,int>> *)
             &b2_2.
              super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
              .
              super_btree_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
              .tree_.size_,
             &allocator2.
              super_CountingAllocator<phmap::btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>_>
            );
  btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>
  ::btree_container((btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>
                     *)local_320,&local_321,
                    (allocator_type *)
                    &b2_2.
                     super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
                     .
                     super_btree_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
                     .tree_.size_);
  anon_unknown_0::PropagatingCountingAlloc<std::pair<int,_int>_>::~PropagatingCountingAlloc
            ((PropagatingCountingAlloc<std::pair<int,_int>_> *)
             &b2_2.
              super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
              .
              super_btree_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
              .tree_.size_);
  PropagatingCountingAlloc<std::pair<int,int>>::
  CountingAllocator<phmap::btree_set<std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,int>>>>
            ((PropagatingCountingAlloc<std::pair<int,int>> *)&original_bytes1_2,&local_28);
  btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>
  ::btree_container((btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>
                     *)local_350,&local_351,(allocator_type *)&original_bytes1_2);
  anon_unknown_0::PropagatingCountingAlloc<std::pair<int,_int>_>::~PropagatingCountingAlloc
            ((PropagatingCountingAlloc<std::pair<int,_int>_> *)&original_bytes1_2);
  local_368 = bytes2;
  local_370 = Generator<std::pair<int,_int>_>::operator()
                        ((Generator<std::pair<int,_int>_> *)((long)&unused1 + 4),0);
  btree_set_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
  ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>,_std::pair<int,_int>_&,_std::pair<int,_int>_*>,_bool>
            *)&gtest_ar_9.message_,
           (btree_set_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
            *)local_320,&local_370);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_398,"bytes1","original_bytes1",&bytes2,&local_368);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_398);
  if (!bVar1) {
    testing::Message::Message(&local_3a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_398);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2eb,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_3a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_3a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_398);
  swap<std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,int>>>
            ((btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>
              *)local_320,
             (btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>
              *)local_350);
  local_3c0 = btree_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
              ::size((btree_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
                      *)local_320);
  local_3c4 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_3b8,"b1.size()","0",&local_3c0,&local_3c4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b8);
  if (!bVar1) {
    testing::Message::Message(&local_3d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2ef,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_3d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_3d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b8);
  local_3f0 = btree_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
              ::size((btree_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
                      *)local_350);
  local_3f4 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_3e8,"b2.size()","1",&local_3f0,&local_3f4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e8);
  if (!bVar1) {
    testing::Message::Message(&local_400);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2f0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_400);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_400);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e8);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_418,"bytes1","original_bytes1",&bytes2,&local_368);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_418);
  if (!bVar1) {
    testing::Message::Message(&local_420);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_418);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffbd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2f1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffffbd8,&local_420);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffbd8);
    testing::Message::~Message(&local_420);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_418);
  for (local_42c = 1; local_42c < 1000; local_42c = local_42c + 1) {
    local_434 = Generator<std::pair<int,_int>_>::operator()
                          ((Generator<std::pair<int,_int>_> *)((long)&unused1 + 4),local_42c);
    btree_set_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
    ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>,_std::pair<int,_int>_&,_std::pair<int,_int>_*>,_bool>
              *)&gtest_ar_13.message_,
             (btree_set_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
              *)local_320,&local_434);
  }
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_460,"bytes2","bytes1",(long *)&allocator1,&bytes2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_460);
  if (!bVar1) {
    testing::Message::Message(&local_468);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_460);
    testing::internal::AssertHelper::AssertHelper
              (&local_470,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2f8,pcVar2);
    testing::internal::AssertHelper::operator=(&local_470,&local_468);
    testing::internal::AssertHelper::~AssertHelper(&local_470);
    testing::Message::~Message(&local_468);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_460);
  btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>
  ::~btree_set((btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>
                *)local_350);
  btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>
  ::~btree_set((btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>
                *)local_320);
  CountingAllocator<phmap::btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>_>
  ::deallocate(&allocator2.
                super_CountingAllocator<phmap::btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>_>
               ,p,1);
  CountingAllocator<phmap::btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>_>
  ::deallocate(&local_28,
               (pointer)b1.
                        super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
                        .
                        super_btree_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_>
                        .tree_.size_,1);
  anon_unknown_0::
  PropagatingCountingAlloc<phmap::btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>_>
  ::~PropagatingCountingAlloc
            ((PropagatingCountingAlloc<phmap::btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>_>
              *)&local_28);
  anon_unknown_0::
  PropagatingCountingAlloc<phmap::btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>_>_>
  ::~PropagatingCountingAlloc(&allocator2);
  return;
}

Assistant:

void BtreeAllocatorTest() {
        using value_type = typename T::value_type;

        int64_t bytes1 = 0, bytes2 = 0;
        PropagatingCountingAlloc<T> allocator1(&bytes1);
        PropagatingCountingAlloc<T> allocator2(&bytes2);
        Generator<value_type> generator(1000);

        // Test that we allocate properly aligned memory. If we don't, then Layout
        // will assert fail.
        auto unused1 = allocator1.allocate(1);
        auto unused2 = allocator2.allocate(1);

        // Test copy assignment
        {
            T b1(typename T::key_compare(), allocator1);
            T b2(typename T::key_compare(), allocator2);

            int64_t original_bytes1 = bytes1;
            b1.insert(generator(0));
            EXPECT_GT(bytes1, original_bytes1);

            // This should propagate the allocator.
            b1 = b2;
            EXPECT_EQ(b1.size(), 0);
            EXPECT_EQ(b2.size(), 0);
            EXPECT_EQ(bytes1, original_bytes1);

            for (int i = 1; i < 1000; i++) {
                b1.insert(generator(i));
            }

            // We should have allocated out of allocator2.
            EXPECT_GT(bytes2, bytes1);
        }

        // Test move assignment
        {
            T b1(typename T::key_compare(), allocator1);
            T b2(typename T::key_compare(), allocator2);

            int64_t original_bytes1 = bytes1;
            b1.insert(generator(0));
            EXPECT_GT(bytes1, original_bytes1);

            // This should propagate the allocator.
            b1 = std::move(b2);
            EXPECT_EQ(b1.size(), 0);
            EXPECT_EQ(bytes1, original_bytes1);

            for (int i = 1; i < 1000; i++) {
                b1.insert(generator(i));
            }

            // We should have allocated out of allocator2.
            EXPECT_GT(bytes2, bytes1);
        }

        // Test swap
        {
            T b1(typename T::key_compare(), allocator1);
            T b2(typename T::key_compare(), allocator2);

            int64_t original_bytes1 = bytes1;
            b1.insert(generator(0));
            EXPECT_GT(bytes1, original_bytes1);

            // This should swap the allocators.
            swap(b1, b2);
            EXPECT_EQ(b1.size(), 0);
            EXPECT_EQ(b2.size(), 1);
            EXPECT_GT(bytes1, original_bytes1);

            for (int i = 1; i < 1000; i++) {
                b1.insert(generator(i));
            }

            // We should have allocated out of allocator2.
            EXPECT_GT(bytes2, bytes1);
        }

        allocator1.deallocate(unused1, 1);
        allocator2.deallocate(unused2, 1);
    }